

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

double __thiscall cvm::BasicValue::toDouble(BasicValue *this)

{
  allocator local_31;
  double local_30;
  string local_28;
  
  switch(this->Type) {
  case BoolType:
    local_30 = (double)(int)(this->field_2).BoolVal;
    break;
  case IntType:
    local_30 = (double)(this->field_2).IntVal;
    break;
  case DoubleType:
    local_30 = (this->field_2).DoubleVal;
    break;
  case StringType:
    std::__cxx11::string::string((string *)&local_28,(this->StrVal)._M_dataplus._M_p,&local_31);
    local_30 = std::__cxx11::stod(&local_28,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_28);
    break;
  default:
    local_30 = 0.0;
  }
  return local_30;
}

Assistant:

double BasicValue::toDouble() const {
  switch (Type) {
  default:          return 0.0;
  case IntType:     return static_cast<double>(IntVal);
  case DoubleType:  return DoubleVal;
  case BoolType:    return static_cast<double>(BoolVal);
  case StringType:  return std::stod(StrVal.c_str());
  }
}